

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void quit_hook(char *s)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 7;
  do {
    if (angband_term[lVar1] != (term *)0x0) {
      term_nuke(angband_term[lVar1]);
    }
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  return;
}

Assistant:

static void quit_hook(const char *s)
{
	int j;

	/* Unused parameter */
	(void)s;

	/* Scan windows */
	for (j = ANGBAND_TERM_MAX - 1; j >= 0; j--) {
		/* Unused */
		if (!angband_term[j]) continue;

		/* Nuke it */
		term_nuke(angband_term[j]);
	}
}